

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Radio_Communications_Header.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Radio_Communications_Header::Radio_Communications_Header
          (Radio_Communications_Header *this,EntityIdentifier *ID,KUINT16 RadioID)

{
  KUINT16 RadioID_local;
  EntityIdentifier *ID_local;
  Radio_Communications_Header *this_local;
  
  Header7::Header7(&this->super_Header);
  (this->super_Header).super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Radio_Communications_Header_0033a6f8;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_EntityID,ID);
  this->m_ui16RadioID = RadioID;
  (this->super_Header).super_Header6.m_ui8ProtocolFamily = '\x04';
  (this->super_Header).super_Header6.m_ui8ProtocolVersion = '\x05';
  return;
}

Assistant:

Radio_Communications_Header::Radio_Communications_Header( const EntityIdentifier & ID, KUINT16 RadioID ) :
    m_EntityID( ID ),
    m_ui16RadioID( RadioID )
{
    m_ui8ProtocolFamily = Radio_Communications;
    m_ui8ProtocolVersion = IEEE_1278_1_1995;
}